

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::optimizemesh(tetgenmesh *this)

{
  int iVar1;
  point *ppdVar2;
  point *ppdVar3;
  memorypool *pmVar4;
  long lVar5;
  double dVar6;
  int local_ec;
  int attrnum;
  int n;
  int iter;
  int chkencflag;
  long sptcount;
  long totalsptcount;
  long smtcount;
  long totalsmtcount;
  long remcount;
  long totalremcount;
  double maxdd;
  double ncosdd [6];
  undefined1 local_70 [8];
  optparameters opm;
  int optpasses;
  point *ppt;
  triface checktet;
  badface *parybface;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&ppt);
  optparameters::optparameters((optparameters *)local_70);
  if (this->b->quiet == 0) {
    printf("Optimizing mesh...\n");
  }
  opm.smthiter = (1 << ((byte)this->b->optlevel & 0x1f)) + -1;
  if (this->b->verbose != 0) {
    printf("  Optimization level  = %d.\n",(ulong)(uint)this->b->optlevel);
    printf("  Optimization scheme = %d.\n",(ulong)(uint)this->b->optscheme);
    printf("  Number of iteration = %d.\n",(ulong)(uint)opm.smthiter);
    printf("  Min_Max dihed angle = %g.\n",this->b->optmaxdihedral);
  }
  sptcount = 0;
  smtcount = 0;
  dVar6 = cos((this->b->optmaxdihedral / 180.0) * PI);
  this->cosmaxdihed = dVar6;
  dVar6 = cos((this->b->optminsmtdihed / 180.0) * PI);
  this->cossmtdihed = dVar6;
  dVar6 = cos((this->b->optminslidihed / 180.0) * PI);
  this->cosslidihed = dVar6;
  iVar1 = this->numelemattrib;
  memorypool::traversalinit(this->tetrahedrons);
  ppt = (point *)tetrahedrontraverse(this);
  while (ppt != (point *)0x0) {
    if (this->b->convex == 0) {
LAB_0016ea2d:
      ppdVar2 = ppt;
      ppdVar3 = ppt + 4;
      tetalldihedral(this,*ppdVar3,ppt[5],ppt[6],ppt[7],&maxdd,(double *)&totalremcount,
                     (double *)0x0);
      if ((double)totalremcount < this->cosmaxdihed) {
        arraypool::newindex(this->unflipqueue,(void **)&checktet.ver);
        *(point **)checktet._8_8_ = ppt;
        *(undefined4 *)(checktet._8_8_ + 8) = 0xb;
        *(point *)(checktet._8_8_ + 0x58) = *ppdVar3;
        *(point *)(checktet._8_8_ + 0x60) = ppdVar2[5];
        *(point *)(checktet._8_8_ + 0x68) = ppdVar2[6];
        *(point *)(checktet._8_8_ + 0x70) = ppdVar2[7];
        *(long *)(checktet._8_8_ + 0x20) = totalremcount;
        for (local_ec = 0; local_ec < 6; local_ec = local_ec + 1) {
          *(double *)(checktet._8_8_ + 0x28 + (long)local_ec * 8) = ncosdd[(long)local_ec + -1];
        }
      }
      ppt = (point *)tetrahedrontraverse(this);
    }
    else {
      dVar6 = elemattribute(this,(tetrahedron *)ppt,iVar1 + -1);
      if ((dVar6 != -1.0) || (NAN(dVar6))) goto LAB_0016ea2d;
      ppt = (point *)tetrahedrontraverse(this);
    }
  }
  remcount = improvequalitybyflips(this);
  if ((0 < this->unflipqueue->objects) &&
     (((this->b->optscheme & 2U) != 0 || ((this->b->optscheme & 4U) != 0)))) {
    pmVar4 = (memorypool *)operator_new(0x58);
    memorypool::memorypool(pmVar4,0x10,this->b->tetrahedraperblock,8,0);
    this->badtetrahedrons = pmVar4;
    opm.max_min_volume = 1;
    opm.imprval._0_4_ = 10;
    opm.searchstep._0_4_ = 0x1e;
    for (attrnum = 0; attrnum < opm.smthiter; attrnum = attrnum + 1) {
      totalsmtcount = 0;
      if ((this->b->optscheme & 2U) != 0) {
        lVar5 = improvequalitybysmoothing(this,(optparameters *)local_70);
        smtcount = lVar5 + smtcount;
        if (0 < lVar5) {
          totalsmtcount = improvequalitybyflips(this);
          remcount = totalsmtcount + remcount;
        }
      }
      if ((0 < this->unflipqueue->objects) && ((this->b->optscheme & 4U) != 0)) {
        lVar5 = removeslivers(this,4);
        sptcount = lVar5 + sptcount;
        if (0 < lVar5) {
          totalsmtcount = improvequalitybyflips(this);
          remcount = totalsmtcount + remcount;
        }
      }
      if ((this->unflipqueue->objects < 1) || (totalsmtcount < 1)) break;
    }
    pmVar4 = this->badtetrahedrons;
    if (pmVar4 != (memorypool *)0x0) {
      memorypool::~memorypool(pmVar4);
      operator_delete(pmVar4,0x58);
    }
    this->badtetrahedrons = (memorypool *)0x0;
  }
  if (0 < this->unflipqueue->objects) {
    if (1 < this->b->verbose) {
      printf("    %ld bad tets remained.\n",this->unflipqueue->objects);
    }
    arraypool::restart(this->unflipqueue);
  }
  if (this->b->verbose != 0) {
    if (0 < remcount) {
      printf("  Removed %ld edges.\n",remcount);
    }
    if (0 < smtcount) {
      printf("  Smoothed %ld points.\n",smtcount);
    }
    if (0 < sptcount) {
      printf("  Split %ld slivers.\n",sptcount);
    }
  }
  return;
}

Assistant:

void tetgenmesh::optimizemesh()
{
  badface *parybface;
  triface checktet;
  point *ppt;
  int optpasses;
  optparameters opm;
  REAL ncosdd[6], maxdd;
  long totalremcount, remcount;
  long totalsmtcount, smtcount;
  long totalsptcount, sptcount;
  int chkencflag;
  int iter;
  int n;

  if (!b->quiet) {
    printf("Optimizing mesh...\n");
  }

  optpasses = ((1 << b->optlevel) - 1);

  if (b->verbose) {
    printf("  Optimization level  = %d.\n", b->optlevel);
    printf("  Optimization scheme = %d.\n", b->optscheme);
    printf("  Number of iteration = %d.\n", optpasses);
    printf("  Min_Max dihed angle = %g.\n", b->optmaxdihedral);
  }

  totalsmtcount = totalsptcount = totalremcount = 0l;

  cosmaxdihed = cos(b->optmaxdihedral / 180.0 * PI);
  cossmtdihed = cos(b->optminsmtdihed / 180.0 * PI);
  cosslidihed = cos(b->optminslidihed / 180.0 * PI);

  int attrnum = numelemattrib - 1; 

  // Put all bad tetrahedra into array.
  tetrahedrons->traversalinit();
  checktet.tet = tetrahedrontraverse();
  while (checktet.tet != NULL) {
    if (b->convex) { // -c
      // Skip this tet if it lies in the exterior.
      if (elemattribute(checktet.tet, attrnum) == -1.0) {
        checktet.tet = tetrahedrontraverse();
        continue;
      }
    }
    ppt = (point *) & (checktet.tet[4]);
    tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], ncosdd, &maxdd, NULL);
    if (maxdd < cosmaxdihed) {
      // There are bad dihedral angles in this tet.
      unflipqueue->newindex((void **) &parybface); 
      parybface->tt.tet = checktet.tet;
      parybface->tt.ver = 11;
      parybface->forg = ppt[0];
      parybface->fdest = ppt[1];
      parybface->fapex = ppt[2];
      parybface->foppo = ppt[3];
      parybface->key = maxdd;
      for (n = 0; n < 6; n++) {
        parybface->cent[n] = ncosdd[n];
      }
    }
    checktet.tet = tetrahedrontraverse();
  }

  totalremcount = improvequalitybyflips();

  if ((unflipqueue->objects > 0l) && 
      ((b->optscheme & 2) || (b->optscheme & 4))) {
    // The pool is only used by removeslivers().
    badtetrahedrons = new memorypool(sizeof(triface), b->tetrahedraperblock,
                                     sizeof(void *), 0);

    // Smoothing options.
    opm.min_max_dihedangle = 1;
    opm.numofsearchdirs = 10;
    // opm.searchstep = 0.001;  
    opm.maxiter = 30; // Limit the maximum iterations.
    //opm.checkencflag = 4; // Queue affected tets after smoothing.
    chkencflag = 4; // Queue affected tets after splitting a sliver.
    iter = 0;

    while (iter < optpasses) {
      smtcount = sptcount = remcount = 0l;
      if (b->optscheme & 2) {
        smtcount += improvequalitybysmoothing(&opm);
        totalsmtcount += smtcount;
        if (smtcount > 0l) {
          remcount = improvequalitybyflips();
          totalremcount += remcount;
        }
      }
      if (unflipqueue->objects > 0l) {
        if (b->optscheme & 4) {
          sptcount += removeslivers(chkencflag);
          totalsptcount += sptcount;
          if (sptcount > 0l) {
            remcount = improvequalitybyflips();
            totalremcount += remcount;
          }
        }
      }
      if (unflipqueue->objects > 0l) {
        if (remcount > 0l) {
          iter++;
        } else {
          break;
        }
      } else {
        break;
      }
    } // while (iter)

    delete badtetrahedrons;
    badtetrahedrons = NULL;
  }

  if (unflipqueue->objects > 0l) {
    if (b->verbose > 1) {
      printf("    %ld bad tets remained.\n", unflipqueue->objects);
    }
    unflipqueue->restart();
  }

  if (b->verbose) {
    if (totalremcount > 0l) {
      printf("  Removed %ld edges.\n", totalremcount);
    }
    if (totalsmtcount > 0l) {
      printf("  Smoothed %ld points.\n", totalsmtcount);
    }
    if (totalsptcount > 0l) {
      printf("  Split %ld slivers.\n", totalsptcount);
    }
  }
}